

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O1

float mf_predict<sparse_parameters>(gdmf *d,example *ec,sparse_parameters *weights)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  pointer pbVar4;
  char *pcVar5;
  float *pfVar6;
  __node_base_ptr p_Var7;
  _Hash_node_base *p_Var8;
  v_array<float> *this;
  example *ec_00;
  vw *pvVar9;
  string *i;
  __node_base_ptr p_Var10;
  weight *pwVar11;
  vw_exception *this_00;
  __hash_code __code;
  _Hash_node_base *p_Var12;
  float **ppfVar13;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  pointer pbVar18;
  ulong *puVar19;
  float *pfVar20;
  __node_base_ptr p_Var21;
  size_t *psVar22;
  gdmf *d_00;
  bool bVar23;
  float fVar24;
  float extraout_XMM0_Da;
  float linear_prediction;
  pred_offset x_dot_r;
  pred_offset x_dot_l;
  float local_22c;
  float local_21c;
  float **local_218;
  pointer local_210;
  gdmf *local_208;
  float local_200 [2];
  long local_1f8;
  v_array<float> *local_1f0;
  example *local_1e8;
  vw *local_1e0;
  string local_1d8;
  float local_1b8 [2];
  ulong local_1b0;
  ostream local_1a8;
  
  local_1e0 = d->all;
  pbVar4 = (local_1e0->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar18 = (local_1e0->pairs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar4; pbVar18 = pbVar18 + 1
      ) {
    pcVar5 = (pbVar18->_M_dataplus)._M_p;
    cVar1 = *pcVar5;
    cVar2 = pcVar5[1];
    sVar17 = ec->num_features -
             ((long)(ec->super_example_predict).feature_space[cVar2].values._end -
              (long)(ec->super_example_predict).feature_space[cVar2].values._begin >> 2) *
             ((long)(ec->super_example_predict).feature_space[cVar1].values._end -
              (long)(ec->super_example_predict).feature_space[cVar1].values._begin >> 2);
    ec->num_features = sVar17;
    cVar1 = *(pbVar18->_M_dataplus)._M_p;
    sVar17 = (ulong)d->rank *
             ((long)(ec->super_example_predict).feature_space[cVar1].values._end -
              (long)(ec->super_example_predict).feature_space[cVar1].values._begin >> 2) + sVar17;
    ec->num_features = sVar17;
    cVar1 = (pbVar18->_M_dataplus)._M_p[1];
    ec->num_features =
         (ulong)d->rank *
         ((long)(ec->super_example_predict).feature_space[cVar1].values._end -
          (long)(ec->super_example_predict).feature_space[cVar1].values._begin >> 2) + sVar17;
  }
  local_22c = (ec->l).simple.initial;
  local_1f0 = &d->scalars;
  local_208 = d;
  v_array<float>::clear(local_1f0);
  local_21c = 0.0;
  pbVar14 = (ec->super_example_predict).indices._begin;
  local_210 = (pointer)(ec->super_example_predict).indices._end;
  if ((pointer)pbVar14 != local_210) {
    fVar24 = 0.0;
    local_218 = &weights->default_value;
    uVar16 = (weights->_map)._M_h._M_bucket_count;
    do {
      bVar3 = *pbVar14;
      pfVar20 = (ec->super_example_predict).feature_space[bVar3].values._begin;
      pfVar6 = (ec->super_example_predict).feature_space[bVar3].values._end;
      if (pfVar20 != pfVar6) {
        puVar19 = (ec->super_example_predict).feature_space[bVar3].indicies._begin;
        do {
          p_Var12 = (_Hash_node_base *)(*puVar19 & weights->_weight_mask);
          uVar15 = (ulong)p_Var12 % uVar16;
          p_Var7 = (weights->_map)._M_h._M_buckets[uVar15];
          p_Var10 = (__node_base_ptr)0x0;
          if ((p_Var7 != (__node_base_ptr)0x0) &&
             (p_Var10 = p_Var7, p_Var21 = p_Var7->_M_nxt, p_Var12 != p_Var7->_M_nxt[1]._M_nxt)) {
            while (p_Var8 = p_Var21->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
              p_Var10 = (__node_base_ptr)0x0;
              if (((ulong)p_Var8[1]._M_nxt % uVar16 != uVar15) ||
                 (p_Var10 = p_Var21, p_Var21 = p_Var8, p_Var12 == p_Var8[1]._M_nxt))
              goto LAB_001a0914;
            }
            p_Var10 = (__node_base_ptr)0x0;
          }
LAB_001a0914:
          if (p_Var10 == (__node_base_ptr)0x0) {
            p_Var12 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var12 = p_Var10->_M_nxt;
          }
          ppfVar13 = (float **)(p_Var12 + 2);
          if (p_Var12 == (_Hash_node_base *)0x0) {
            ppfVar13 = local_218;
          }
          fVar24 = fVar24 + **ppfVar13 * *pfVar20;
          pfVar20 = pfVar20 + 1;
          puVar19 = puVar19 + 1;
          local_21c = fVar24;
        } while (pfVar20 != pfVar6);
      }
      pbVar14 = pbVar14 + 1;
    } while ((pointer)pbVar14 != local_210);
  }
  local_1e8 = ec;
  v_array<float>::push_back(local_1f0,&local_21c);
  local_22c = local_22c + local_21c;
  pbVar18 = (local_208->all->pairs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_210 = (local_208->all->pairs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  d_00 = local_208;
  if (pbVar18 != local_210) {
    do {
      pcVar5 = (pbVar18->_M_dataplus)._M_p;
      cVar1 = *pcVar5;
      if ((((ec->super_example_predict).feature_space[cVar1].values._end !=
            (ec->super_example_predict).feature_space[cVar1].values._begin) &&
          (cVar1 = pcVar5[1],
          (ec->super_example_predict).feature_space[cVar1].values._end !=
          (ec->super_example_predict).feature_space[cVar1].values._begin)) && (d_00->rank != 0)) {
        uVar16 = 1;
        do {
          local_1b8[0] = 0.0;
          cVar1 = *(pbVar18->_M_dataplus)._M_p;
          pfVar20 = (ec->super_example_predict).feature_space[cVar1].values._begin;
          pfVar6 = (ec->super_example_predict).feature_space[cVar1].values._end;
          local_1b0 = uVar16;
          if (pfVar20 != pfVar6) {
            psVar22 = (ec->super_example_predict).feature_space[cVar1].indicies._begin;
            do {
              local_218 = (float **)CONCAT44(local_218._4_4_,*pfVar20);
              pwVar11 = sparse_parameters::operator[](weights,*psVar22);
              local_1b8[0] = local_218._0_4_ * pwVar11[local_1b0] + local_1b8[0];
              pfVar20 = pfVar20 + 1;
              psVar22 = psVar22 + 1;
            } while (pfVar20 != pfVar6);
          }
          local_200[0] = 0.0;
          local_1f8 = local_208->rank + uVar16;
          cVar1 = (pbVar18->_M_dataplus)._M_p[1];
          pfVar20 = (ec->super_example_predict).feature_space[cVar1].values._begin;
          pfVar6 = (ec->super_example_predict).feature_space[cVar1].values._end;
          if (pfVar20 != pfVar6) {
            psVar22 = (ec->super_example_predict).feature_space[cVar1].indicies._begin;
            do {
              local_218 = (float **)CONCAT44(local_218._4_4_,*pfVar20);
              pwVar11 = sparse_parameters::operator[](weights,*psVar22);
              local_200[0] = local_218._0_4_ * pwVar11[local_1f8] + local_200[0];
              pfVar20 = pfVar20 + 1;
              psVar22 = psVar22 + 1;
            } while (pfVar20 != pfVar6);
          }
          this = local_1f0;
          local_22c = local_22c + local_1b8[0] * local_200[0];
          v_array<float>::push_back(local_1f0,local_1b8);
          v_array<float>::push_back(this,local_200);
          bVar23 = uVar16 < local_208->rank;
          uVar16 = uVar16 + 1;
          d_00 = local_208;
        } while (bVar23);
      }
      pbVar18 = pbVar18 + 1;
    } while (pbVar18 != local_210);
  }
  pvVar9 = local_1e0;
  ec_00 = local_1e8;
  if ((local_1e0->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_1e0->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a8,"cannot use triples in matrix factorization",0x2a);
    this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
               ,0x96,&local_1d8);
    __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_1e8->partial_prediction = local_22c;
  (*local_1e0->set_minmax)(local_1e0->sd,(local_1e8->l).simple.label);
  fVar24 = GD::finalize_prediction(pvVar9->sd,ec_00->partial_prediction);
  (ec_00->pred).scalar = fVar24;
  fVar24 = (ec_00->l).simple.label;
  if ((fVar24 != 3.4028235e+38) || (NAN(fVar24))) {
    (*pvVar9->loss->_vptr_loss_function[1])(pvVar9->loss,pvVar9->sd);
    ec_00->loss = extraout_XMM0_Da * ec_00->weight;
  }
  if (pvVar9->audit == true) {
    print_result(d_00->all->stdout_fileno,(ec_00->pred).scalar,-1.0,ec_00->tag);
    mf_print_offset_features(d_00,ec_00,0);
  }
  return (ec_00->pred).scalar;
}

Assistant:

float mf_predict(gdmf& d, example& ec, T& weights)
{
  vw& all = *d.all;
  label_data& ld = ec.l.simple;
  float prediction = ld.initial;

  for (string& i : d.all->pairs)
  {
    ec.num_features -= ec.feature_space[(int)i[0]].size() * ec.feature_space[(int)i[1]].size();
    ec.num_features += ec.feature_space[(int)i[0]].size() * d.rank;
    ec.num_features += ec.feature_space[(int)i[1]].size() * d.rank;
  }

  // clear stored predictions
  d.scalars.clear();

  float linear_prediction = 0.;
  // linear terms

  for (features& fs : ec) GD::foreach_feature<float, GD::vec_add, T>(weights, fs, linear_prediction);

  // store constant + linear prediction
  // note: constant is now automatically added
  d.scalars.push_back(linear_prediction);

  prediction += linear_prediction;
  // interaction terms
  for (string& i : d.all->pairs)
  {
    if (ec.feature_space[(int)i[0]].size() > 0 && ec.feature_space[(int)i[1]].size() > 0)
    {
      for (uint64_t k = 1; k <= d.rank; k++)
      {
        // x_l * l^k
        // l^k is from index+1 to index+d.rank
        // float x_dot_l = sd_offset_add(weights, ec.atomics[(int)(*i)[0]].begin(), ec.atomics[(int)(*i)[0]].end(), k);
        pred_offset x_dot_l = {0., k};
        GD::foreach_feature<pred_offset, offset_add, T>(weights, ec.feature_space[(int)i[0]], x_dot_l);
        // x_r * r^k
        // r^k is from index+d.rank+1 to index+2*d.rank
        // float x_dot_r = sd_offset_add(weights, ec.atomics[(int)(*i)[1]].begin(), ec.atomics[(int)(*i)[1]].end(),
        // k+d.rank);
        pred_offset x_dot_r = {0., k + d.rank};
        GD::foreach_feature<pred_offset, offset_add, T>(weights, ec.feature_space[(int)i[1]], x_dot_r);

        prediction += x_dot_l.p * x_dot_r.p;

        // store prediction from interaction terms
        d.scalars.push_back(x_dot_l.p);
        d.scalars.push_back(x_dot_r.p);
      }
    }
  }

  if (all.triples.begin() != all.triples.end())
    THROW("cannot use triples in matrix factorization");

  // d.scalars has linear, x_dot_l_1, x_dot_r_1, x_dot_l_2, x_dot_r_2, ...

  ec.partial_prediction = prediction;

  all.set_minmax(all.sd, ld.label);

  ec.pred.scalar = GD::finalize_prediction(all.sd, ec.partial_prediction);

  if (ld.label != FLT_MAX)
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) * ec.weight;

  if (all.audit)
    mf_print_audit_features(d, ec, 0);

  return ec.pred.scalar;
}